

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void google::protobuf::internal::PackedFieldHelper<2>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  RepeatedField<float> *array;
  int i;
  long lVar1;
  long lVar2;
  
  if (*field != 0) {
    io::CodedOutputStream::WriteVarint32(output,md->tag);
    io::CodedOutputStream::WriteVarint32(output,*(uint32 *)((long)field + 0x10));
    lVar2 = 0;
    for (lVar1 = 0; lVar1 < *field; lVar1 = lVar1 + 1) {
      PrimitiveTypeHelper<7>::Serialize((void *)(*(long *)((long)field + 8) + lVar2),output);
      lVar2 = lVar2 + 4;
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}